

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandShowBdd(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  char *pcVar5;
  uint local_34;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  local_34 = 0;
  Extra_UtilGetoptReset();
  bVar1 = false;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"cgh"), iVar2 == 0x67) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar2 == -1) break;
    if (iVar2 != 99) {
      pcVar5 = "yes";
      if (!bVar1) {
        pcVar5 = "no";
      }
LAB_002201e1:
      iVar2 = -2;
      Abc_Print(-2,"usage: show_bdd [-cgh] <node>\n");
      Abc_Print(-2,"       uses DOT and GSVIEW to visualize the global BDDs of primary outputs\n");
      Abc_Print(-2,
                "       in terms of primary inputs or the local BDD of a node in terms of its fanins\n"
               );
      Abc_Print(-2,
                "\t<node>: (optional) the node to consider [default = the driver of the first PO]\n"
               );
      pcVar4 = "yes";
      if (local_34 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c    : toggle visualizing BDD with complemented edges [default = %s].\n",
                pcVar4);
      Abc_Print(-2,
                "\t-g    : toggle visualizing the global BDDs of primary outputs [default = %s].\n",
                pcVar5);
      pcVar5 = "\t-h    : print the command usage\n";
LAB_002202b7:
      Abc_Print(iVar2,pcVar5);
      return 1;
    }
    local_34 = local_34 ^ 1;
  }
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pcVar5 = "Empty network.\n";
  }
  else {
    if (bVar1) {
      pNtk_00 = pNtk;
      if (pNtk->ntkType != ABC_NTK_STRASH) {
        pNtk_00 = Abc_NtkStrash(pNtk,0,0,0);
      }
      Abc_NtkShowBdd(pNtk_00,local_34);
      if (pNtk_00 != pNtk) {
        Abc_NtkDelete(pNtk_00);
        return 0;
      }
      return 0;
    }
    if ((pNtk->ntkFunc == ABC_FUNC_BDD) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
      if (argc <= globalUtilOptind + 1) {
        if (globalUtilOptind == argc) {
          pAVar3 = Abc_NtkPo(pNtk,0);
          pAVar3 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
          if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7) {
LAB_00220329:
            Abc_NodeShowBdd(pAVar3,local_34);
            return 0;
          }
          pcVar5 = Abc_ObjName(pAVar3);
          pcVar4 = "The driver \"%s\" of the first PO is not an internal node.\n";
        }
        else {
          pAVar3 = Abc_NtkFindNode(pNtk,argv[globalUtilOptind]);
          if (pAVar3 != (Abc_Obj_t *)0x0) goto LAB_00220329;
          pcVar5 = argv[globalUtilOptind];
          pcVar4 = "Cannot find node \"%s\".\n";
        }
        Abc_Print(-1,pcVar4,pcVar5);
        return 1;
      }
      Abc_Print(-1,"Wrong number of auguments.\n");
      pcVar5 = "no";
      goto LAB_002201e1;
    }
    pcVar5 = "Visualizing BDDs can only be done for logic BDD networks (run \"bdd\").\n";
  }
  iVar2 = -1;
  goto LAB_002202b7;
}

Assistant:

int Abc_CommandShowBdd( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pNode;
    int c, fCompl = 0, fGlobal = 0;
    extern void Abc_NodeShowBdd( Abc_Obj_t * pNode, int fCompl );
    extern void Abc_NtkShowBdd( Abc_Ntk_t * pNtk, int fCompl );

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cgh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fCompl ^= 1;
            break;
        case 'g':
            fGlobal ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fGlobal )
    {
        Abc_Ntk_t * pTemp = Abc_NtkIsStrash(pNtk) ? pNtk : Abc_NtkStrash(pNtk, 0, 0, 0);
        Abc_NtkShowBdd( pTemp, fCompl );
        if ( pTemp != pNtk )
            Abc_NtkDelete( pTemp );
        return 0;
    }

    if ( !Abc_NtkIsBddLogic(pNtk) )
    {
        Abc_Print( -1, "Visualizing BDDs can only be done for logic BDD networks (run \"bdd\").\n" );
        return 1;
    }
    if ( argc > globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }
    if ( argc == globalUtilOptind )
    {
        pNode = Abc_ObjFanin0( Abc_NtkPo(pNtk, 0) );
        if ( !Abc_ObjIsNode(pNode) )
        {
            Abc_Print( -1, "The driver \"%s\" of the first PO is not an internal node.\n", Abc_ObjName(pNode) );
            return 1;
        }
    }
    else
    {
        pNode = Abc_NtkFindNode( pNtk, argv[globalUtilOptind] );
        if ( pNode == NULL )
        {
            Abc_Print( -1, "Cannot find node \"%s\".\n", argv[globalUtilOptind] );
            return 1;
        }
    }
    Abc_NodeShowBdd( pNode, fCompl );
    return 0;

usage:
    Abc_Print( -2, "usage: show_bdd [-cgh] <node>\n" );
    Abc_Print( -2, "       uses DOT and GSVIEW to visualize the global BDDs of primary outputs\n" );
    Abc_Print( -2, "       in terms of primary inputs or the local BDD of a node in terms of its fanins\n" );
#ifdef WIN32
    Abc_Print( -2, "       \"dot.exe\" and \"gsview32.exe\" should be set in the paths\n" );
    Abc_Print( -2, "       (\"gsview32.exe\" may be in \"C:\\Program Files\\Ghostgum\\gsview\\\")\n" );
#endif
    Abc_Print( -2, "\t<node>: (optional) the node to consider [default = the driver of the first PO]\n");
    Abc_Print( -2, "\t-c    : toggle visualizing BDD with complemented edges [default = %s].\n", fCompl? "yes": "no" );
    Abc_Print( -2, "\t-g    : toggle visualizing the global BDDs of primary outputs [default = %s].\n", fGlobal? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}